

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint local_b4;
  U32 minStatePlus;
  U32 maxBitsOut;
  uint s_1;
  uint total;
  BYTE s;
  U32 u_1;
  int freq;
  int nbOccurrences;
  U32 symbol;
  U32 position;
  U32 u;
  U32 highThreshold;
  BYTE *tableSymbol;
  U32 *cumul;
  U32 step;
  FSE_symbolCompressionTransform *symbolTT;
  void *FSCT;
  U16 *tableU16;
  void *ptr;
  U32 tableMask;
  U32 tableSize;
  size_t wkspSize_local;
  void *workSpace_local;
  uint tableLog_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  FSE_CTable *ct_local;
  
  bVar4 = (byte)tableLog;
  uVar3 = 1 << (bVar4 & 0x1f);
  if (tableLog == 0) {
    local_b4 = 1;
  }
  else {
    local_b4 = uVar3 >> 1;
  }
  uVar6 = (ulong)local_b4;
  uVar5 = maxSymbolValue + 2;
  position = uVar3 - 1;
  if (((ulong)workSpace & 3) == 0) {
    if (wkspSize < ((ulong)(maxSymbolValue + 2) + (1L << (bVar4 - 2 & 0x3f))) * 4) {
      ct_local = (FSE_CTable *)0xffffffffffffffd4;
    }
    else {
      *(short *)ct = (short)tableLog;
      *(short *)((long)ct + 2) = (short)maxSymbolValue;
      *(undefined4 *)workSpace = 0;
      for (symbol = 1; symbol <= maxSymbolValue + 1; symbol = symbol + 1) {
        if (normalizedCounter[symbol - 1] == -1) {
          *(int *)((long)workSpace + (ulong)symbol * 4) =
               *(int *)((long)workSpace + (ulong)(symbol - 1) * 4) + 1;
          *(char *)((long)workSpace + (ulong)position + (ulong)uVar5 * 4) = (char)symbol + -1;
          position = position - 1;
        }
        else {
          *(int *)((long)workSpace + (ulong)symbol * 4) =
               *(int *)((long)workSpace + (ulong)(symbol - 1) * 4) +
               (int)normalizedCounter[symbol - 1];
        }
      }
      *(uint *)((long)workSpace + (ulong)(maxSymbolValue + 1) * 4) = uVar3 + 1;
      nbOccurrences = 0;
      for (freq = 0; (uint)freq <= maxSymbolValue; freq = freq + 1) {
        sVar1 = normalizedCounter[(uint)freq];
        for (u_1 = 0; (int)u_1 < (int)sVar1; u_1 = u_1 + 1) {
          *(char *)((long)workSpace + (ulong)(uint)nbOccurrences + (ulong)uVar5 * 4) = (char)freq;
          do {
            nbOccurrences = nbOccurrences + (uVar3 >> 1) + (uVar3 >> 3) + 3 & uVar3 - 1;
          } while (position < (uint)nbOccurrences);
        }
      }
      for (total = 0; total < uVar3; total = total + 1) {
        uVar7 = (ulong)*(byte *)((long)workSpace + (ulong)total + (ulong)uVar5 * 4);
        uVar2 = *(uint *)((long)workSpace + uVar7 * 4);
        *(uint *)((long)workSpace + uVar7 * 4) = uVar2 + 1;
        *(short *)((long)ct + (ulong)uVar2 * 2 + 4) = (short)uVar3 + (short)total;
      }
      maxBitsOut = 0;
      for (minStatePlus = 0; minStatePlus <= maxSymbolValue; minStatePlus = minStatePlus + 1) {
        sVar1 = normalizedCounter[minStatePlus];
        if (sVar1 == -1) {
LAB_0035d900:
          ct[uVar6 + (ulong)minStatePlus * 2 + 2] = tableLog * 0x10000 - (1 << (bVar4 & 0x1f));
          ct[uVar6 + (ulong)minStatePlus * 2 + 1] = maxBitsOut - 1;
          maxBitsOut = maxBitsOut + 1;
        }
        else if (sVar1 == 0) {
          ct[uVar6 + (ulong)minStatePlus * 2 + 2] = (tableLog + 1) * 0x10000 - (1 << (bVar4 & 0x1f))
          ;
        }
        else {
          if (sVar1 == 1) goto LAB_0035d900;
          uVar3 = BIT_highbit32((int)normalizedCounter[minStatePlus] - 1);
          ct[uVar6 + (ulong)minStatePlus * 2 + 2] =
               (tableLog - uVar3) * 0x10000 -
               ((int)normalizedCounter[minStatePlus] << ((byte)(tableLog - uVar3) & 0x1f));
          ct[uVar6 + (ulong)minStatePlus * 2 + 1] =
               maxBitsOut - (int)normalizedCounter[minStatePlus];
          maxBitsOut = (int)normalizedCounter[minStatePlus] + maxBitsOut;
        }
      }
      ct_local = (FSE_CTable *)0x0;
    }
  }
  else {
    ct_local = (FSE_CTable *)0xffffffffffffffff;
  }
  return (size_t)ct_local;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);

    U32* cumul = (U32*)workSpace;
    FSE_FUNCTION_TYPE* tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSymbolValue + 2));

    U32 highThreshold = tableSize-1;

    if ((size_t)workSpace & 3) return ERROR(GENERIC); /* Must be 4 byte aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * http://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSymbolValue+1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                cumul[u] = cumul[u-1] + normalizedCounter[u-1];
        }   }
        cumul[maxSymbolValue+1] = tableSize+1;
    }

    /* Spread symbols */
    {   U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }

        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                symbolTT[s].deltaFindState = total - 1;
                total ++;
                break;
            default :
                {
                    U32 const maxBitsOut = tableLog - BIT_highbit32 (normalizedCounter[s]-1);
                    U32 const minStatePlus = normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = total - normalizedCounter[s];
                    total +=  normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
        }
    }
#endif

    return 0;
}